

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

XmlReaderPtr __thiscall
Assimp::Ogre::OgreXmlSerializer::OpenReader
          (OgreXmlSerializer *this,IOSystem *pIOHandler,string *filename)

{
  bool bVar1;
  int iVar2;
  IOStream *_stream;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *__p;
  Logger *pLVar3;
  DeadlyImportError *pDVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  XmlReaderPtr XVar6;
  char *local_1c8 [4];
  string local_1a8 [11];
  undefined4 extraout_var;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,".skeleton.xml",(allocator<char> *)local_1c8);
  bVar1 = EndsWith(filename,local_1a8,false);
  std::__cxx11::string::~string((string *)local_1a8);
  if (bVar1) {
    iVar2 = (*pIOHandler->_vptr_IOSystem[2])(pIOHandler,(filename->_M_dataplus)._M_p);
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,"rb",(allocator<char> *)local_1c8);
      iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                        (pIOHandler,(filename->_M_dataplus)._M_p,local_1a8[0]._M_dataplus._M_p);
      _stream = (IOStream *)CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::~string((string *)local_1a8);
      if (_stream == (IOStream *)0x0) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a8,"Failed to open skeleton file ",filename);
        DeadlyImportError::DeadlyImportError(pDVar4,local_1a8);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
      CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
      __p = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
      std::__shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,void>
                ((__shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,(__gnu_cxx::_Lock_policy)2>
                  *)this,__p);
      if (this->m_reader == (XmlReader *)0x0) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a8,"Failed to create XML reader for skeleton file ",filename);
        DeadlyImportError::DeadlyImportError(pDVar4,local_1a8);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
      (*_stream->_vptr_IOStream[1])(_stream);
      _Var5._M_pi = extraout_RDX;
      goto LAB_0044b038;
    }
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[31]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [31])"Failed to find skeleton file \'");
    std::operator<<((ostream *)local_1a8,(string *)filename);
    std::operator<<((ostream *)local_1a8,"\' that is referenced by imported Mesh.");
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar3,local_1c8[0]);
  }
  else {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [46])"Imported Mesh is referencing to unsupported \'");
    std::operator<<((ostream *)local_1a8,(string *)filename);
    std::operator<<((ostream *)local_1a8,"\' skeleton file.");
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar3,local_1c8[0]);
  }
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  this->m_reader = (XmlReader *)0x0;
  (this->m_currentNodeName)._M_dataplus._M_p = (pointer)0x0;
  _Var5._M_pi = extraout_RDX_00;
LAB_0044b038:
  XVar6.
  super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  XVar6.
  super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (XmlReaderPtr)
         XVar6.
         super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

XmlReaderPtr OgreXmlSerializer::OpenReader(Assimp::IOSystem *pIOHandler, const std::string &filename)
{
    if (!EndsWith(filename, ".skeleton.xml", false))
    {
        ASSIMP_LOG_ERROR_F("Imported Mesh is referencing to unsupported '", filename, "' skeleton file.");
        return XmlReaderPtr();
    }

    if (!pIOHandler->Exists(filename))
    {
        ASSIMP_LOG_ERROR_F("Failed to find skeleton file '", filename, "' that is referenced by imported Mesh.");
        return XmlReaderPtr();
    }

    std::unique_ptr<IOStream> file(pIOHandler->Open(filename));
    if (!file.get()) {
        throw DeadlyImportError("Failed to open skeleton file " + filename);
    }

    std::unique_ptr<CIrrXML_IOStreamReader> stream(new CIrrXML_IOStreamReader(file.get()));
    XmlReaderPtr reader = XmlReaderPtr(irr::io::createIrrXMLReader(stream.get()));
    if (!reader.get()) {
        throw DeadlyImportError("Failed to create XML reader for skeleton file " + filename);
    }
    return reader;
}